

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_ldd.c
# Opt level: O0

void sylvan_init_ldd(void)

{
  sylvan_register_quit(lddmc_quit);
  sylvan_gc_add_mark(lddmc_gc_mark_external_refs_CALL);
  sylvan_gc_add_mark(lddmc_gc_mark_protected_CALL);
  sylvan_gc_add_mark(lddmc_gc_mark_serialize_CALL);
  refs_create(&lddmc_refs,0x400);
  if (lddmc_protected_created == 0) {
    protect_create(&lddmc_protected,0x1000);
    lddmc_protected_created = 1;
  }
  lddmc_refs_init_RUN();
  return;
}

Assistant:

void
sylvan_init_ldd()
{
    sylvan_register_quit(lddmc_quit);
    sylvan_gc_add_mark(TASK(lddmc_gc_mark_external_refs));
    sylvan_gc_add_mark(TASK(lddmc_gc_mark_protected));
    sylvan_gc_add_mark(TASK(lddmc_gc_mark_serialize));

    refs_create(&lddmc_refs, 1024);
    if (!lddmc_protected_created) {
        protect_create(&lddmc_protected, 4096);
        lddmc_protected_created = 1;
    }

    RUN(lddmc_refs_init);
}